

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalVector.hpp
# Opt level: O3

void __thiscall
limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
          (LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *this,
          pair<unsigned_long,_const_cppjieba::DictUnit_*> *t)

{
  pair<unsigned_long,_const_cppjieba::DictUnit_*> *ppVar1;
  size_t sVar2;
  
  sVar2 = this->size_;
  if (sVar2 == this->capacity_) {
    if (sVar2 == 0) {
      __assert_fail("capacity_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/deps/limonp/LocalVector.hpp"
                    ,0x52,
                    "void limonp::LocalVector<std::pair<unsigned long, const cppjieba::DictUnit *>>::push_back(const T &) [T = std::pair<unsigned long, const cppjieba::DictUnit *>]"
                   );
    }
    reserve(this,sVar2 * 2);
    sVar2 = this->size_;
  }
  ppVar1 = this->ptr_;
  this->size_ = sVar2 + 1;
  ppVar1[sVar2].first = t->first;
  ppVar1[sVar2].second = t->second;
  return;
}

Assistant:

void push_back(const T& t) {
    if(size_ == capacity_) {
      assert(capacity_);
      reserve(capacity_ * 2);
    }
    ptr_[size_ ++ ] = t;
  }